

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputStream.cpp
# Opt level: O2

void __thiscall cali::OutputStream::set_filename(OutputStream *this,char *filename)

{
  char *local_18;
  
  local_18 = filename;
  OutputStreamImpl::reset
            ((this->mP).
             super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  std::filesystem::__cxx11::path::operator=
            (&((this->mP).
               super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->filename,&local_18);
  ((this->mP).super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr)->type = File;
  return;
}

Assistant:

void OutputStream::set_filename(const char* filename)
{
    mP->reset();

    mP->filename = filename;
    mP->type     = StreamType::File;
}